

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

ArguDesc *
cxxopts::values::parser_tool::ParseArgument
          (ArguDesc *__return_storage_ptr__,char *arg,bool *matched)

{
  bool bVar1;
  const_reference pvVar2;
  difference_type dVar3;
  string_type local_b0;
  string_type local_90;
  string_type local_70;
  undefined1 local_4d;
  undefined1 local_40 [8];
  match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_> result;
  bool *matched_local;
  char *arg_local;
  ArguDesc *argu_desc;
  
  result._M_begin = matched;
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)local_40);
  std::
  regex_match<char,std::allocator<std::__cxx11::sub_match<char_const*>>,std::__cxx11::regex_traits<char>>
            (arg,(match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                  *)local_40,
             (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             (anonymous_namespace)::option_matcher_abi_cxx11_,0);
  bVar1 = std::__cxx11::
          match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
          empty((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                 *)local_40);
  *result._M_begin = !bVar1;
  local_4d = 0;
  ArguDesc::ArguDesc(__return_storage_ptr__);
  if ((*result._M_begin & 1U) != 0) {
    pvVar2 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)local_40,1);
    std::__cxx11::sub_match<const_char_*>::str(&local_70,pvVar2);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    pvVar2 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)local_40,2);
    dVar3 = std::__cxx11::sub_match<const_char_*>::length(pvVar2);
    __return_storage_ptr__->set_value = 0 < dVar3;
    pvVar2 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)local_40,3);
    std::__cxx11::sub_match<const_char_*>::str(&local_90,pvVar2);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->value,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    pvVar2 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)local_40,4);
    dVar3 = std::__cxx11::sub_match<const_char_*>::length(pvVar2);
    if (0 < dVar3) {
      __return_storage_ptr__->grouping = true;
      pvVar2 = std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)local_40,4);
      std::__cxx11::sub_match<const_char_*>::str(&local_b0,pvVar2);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  local_4d = 1;
  std::__cxx11::match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
  ::~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline ArguDesc ParseArgument(const char *arg, bool &matched)
      {
        std::match_results<const char*> result;
        std::regex_match(arg, result, option_matcher);
        matched = !result.empty();

        ArguDesc argu_desc;
        if (matched) {
          argu_desc.arg_name = result[1].str();
          argu_desc.set_value = result[2].length() > 0;
          argu_desc.value = result[3].str();
          if (result[4].length() > 0)
          {
            argu_desc.grouping = true;
            argu_desc.arg_name = result[4].str();
          }
        }

        return argu_desc;
      }